

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O1

void share_receive(Plug *plug,int urgent,char *data,size_t len)

{
  BinarySink *bs;
  ssh_sharing_connstate *cs;
  byte bVar1;
  _func_int_Plug_ptr_accept_fn_t_accept_ctx_t *p_Var2;
  bool bVar3;
  size_t sVar4;
  _Bool _Var5;
  char cVar6;
  _Bool val;
  code cVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  undefined4 uVar11;
  unsigned_long uVar12;
  uint *puVar13;
  unsigned_long uVar14;
  share_channel *psVar15;
  ssh_rportfwd *psVar16;
  share_forwarding *psVar17;
  _func_void_Plug_ptr_PlugLogType_SockAddr_ptr_int_char_ptr_int *p_Var18;
  unsigned_long uVar19;
  void *pvVar20;
  undefined8 uVar21;
  strbuf *psVar22;
  share_xchannel *psVar23;
  PlugVtable *pPVar24;
  BinarySourceError BVar25;
  undefined4 in_register_00000034;
  ulong uVar26;
  char *pcVar27;
  char *pcVar28;
  long lVar29;
  ptrlen pVar30;
  undefined8 uVar31;
  ssh_sharing_connstate *psVar32;
  int local_c8;
  BinarySource local_a8;
  share_xchannel *local_78;
  char *local_70;
  uint local_68;
  uint local_64;
  undefined4 local_60;
  
  uVar26 = CONCAT44(in_register_00000034,urgent);
  cs = (ssh_sharing_connstate *)(plug + -0x810);
  iVar8 = *(int *)&plug[-0x80d].vt;
  if (iVar8 < 0x70e) {
    if (iVar8 == 0) {
      plug[-9].vt = (PlugVtable *)0x0;
    }
    else if (iVar8 != 0x6e9) goto LAB_001395a8;
    lVar29 = -len;
    pcVar27 = data;
    while( true ) {
      lVar29 = lVar29 + 1;
      data = pcVar27 + 1;
      if (lVar29 == 1) break;
      cVar6 = *pcVar27;
      pPVar24 = plug[-9].vt;
      if (cVar6 == '\n') {
        if ((PlugVtable *)0x2d < pPVar24) {
          pvVar20 = (void *)((long)&plug[-0x80c].vt + 4);
          iVar8 = bcmp(pvVar20,"SSHCONNECTION@putty.projects.tartarus.org-2.0-",0x2e);
          if (iVar8 == 0) {
            if (((undefined1 *)((long)&plug[-0x80c].vt + 3))[(long)pPVar24] == '\r') {
              plug[-9].vt = (PlugVtable *)((long)&pPVar24[-1].accepting + 7);
            }
            len = -lVar29;
            uVar9 = string_length_for_printf((size_t)plug[-9].vt);
            log_downstream(cs,"Downstream version string: %.*s",(ulong)uVar9,pvVar20);
            *(undefined1 *)((long)&plug[-0x80d].vt + 5) = 1;
            goto LAB_00139534;
          }
        }
        pcVar27 = "Version string did not have expected prefix\n";
LAB_001394ee:
        pcVar27 = dupprintf(pcVar27);
        goto LAB_00139590;
      }
      if ((PlugVtable *)0x400f < pPVar24) {
        pcVar27 = "Version string far too long\n";
        goto LAB_001394ee;
      }
      plug[-9].vt = (PlugVtable *)((long)&pPVar24->log + 1);
      ((undefined1 *)((long)&plug[-0x80c].vt + 4))[(long)pPVar24] = cVar6;
      pcVar27 = data;
    }
    uVar11 = 0x6e9;
  }
  else {
    if (iVar8 == 0x70e) goto LAB_00139543;
    if (iVar8 == 0x71b) goto LAB_001395f5;
LAB_001395a8:
    uVar11 = 0;
  }
LAB_001395b1:
  *(undefined4 *)&plug[-0x80d].vt = uVar11;
  return;
LAB_00139534:
  plug[-9].vt = (PlugVtable *)0x0;
  while (plug[-9].vt < (PlugVtable *)0x4) {
LAB_00139543:
    if (len == 0) {
      uVar11 = 0x70e;
      goto LAB_001395b1;
    }
    len = len - 1;
    cVar6 = *data;
    data = data + 1;
    pPVar24 = plug[-9].vt;
    plug[-9].vt = (PlugVtable *)((long)&pPVar24->log + 1);
    ((undefined1 *)((long)&plug[-0x80c].vt + 4))[(long)pPVar24] = cVar6;
  }
  uVar9 = *(uint *)((long)&plug[-0x80c].vt + 4);
  uVar10 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  uVar9 = uVar10 + 4;
  uVar26 = (ulong)uVar9;
  *(uint *)&plug[-0x80c].vt = uVar9;
  if (uVar10 - 0x400d < 0xffffbff4) {
    pcVar27 = dupprintf("Bad packet length %u\n");
LAB_00139590:
    share_disconnect(cs,pcVar27);
    safefree(pcVar27);
    goto LAB_001395a8;
  }
  while (plug[-9].vt < (PlugVtable *)(long)*(int *)&plug[-0x80c].vt) {
LAB_001395f5:
    if (len == 0) {
      uVar11 = 0x71b;
      goto LAB_001395b1;
    }
    len = len - 1;
    cVar6 = *data;
    data = data + 1;
    pPVar24 = plug[-9].vt;
    plug[-9].vt = (PlugVtable *)((long)&pPVar24->log + 1);
    ((undefined1 *)((long)&plug[-0x80c].vt + 4))[(long)pPVar24] = cVar6;
  }
  bVar1 = *(byte *)&plug[-0x80b].vt;
  pvVar20 = (void *)((long)&plug[-0x80b].vt + 1);
  iVar8 = (int)plug[-9].vt + -5;
  local_a8.len = (size_t)iVar8;
  local_a8.binarysource_ = &local_a8;
  local_a8.pos = 0;
  local_a8.err = BSE_NO_ERROR;
  local_a8.data = pvVar20;
  if (bVar1 < 0x50) {
    if (bVar1 == 1) {
      (**(code **)((plug[-0x80f].vt)->log + 8))(plug[-0x80f].vt,uVar26);
      plug[-0x80f].vt = (PlugVtable *)0x0;
      share_try_cleanup(cs);
      goto LAB_00139534;
    }
    if ((bVar1 != 2) && (bVar1 != 4)) {
switchD_00139658_caseD_51:
      pcVar27 = dupprintf("Unexpected packet type %d\n",(ulong)(uint)bVar1);
      goto LAB_0013a179;
    }
switchD_00139658_caseD_5d:
    uVar12 = BinarySource_get_uint32(&local_a8);
    uVar11 = (undefined4)uVar12;
    if (bVar1 != 0x62) {
LAB_0013977d:
      p_Var2 = (plug[-0x80e].vt)->accepting;
      (**(code **)(*(long *)(p_Var2 + 8) + 0x48))
                (p_Var2,*(undefined4 *)&plug[-0x810].vt,bVar1,pvVar20,iVar8,0);
      if ((3 < iVar8 && bVar1 == 0x61) &&
         (local_60 = uVar11,
         psVar15 = (share_channel *)find234((tree234 *)plug[-6].vt,&local_68,(cmpfn234)0x0),
         psVar15 != (share_channel *)0x0)) {
        if (psVar15->state == 2) {
          p_Var2 = (plug[-0x80e].vt)->accepting;
          (**(code **)(*(long *)(p_Var2 + 8) + 0x58))(p_Var2,psVar15->upstream_id);
          share_remove_channel(cs,psVar15);
        }
        else {
          psVar15->state = 1;
        }
      }
      goto LAB_00139534;
    }
    pVar30 = BinarySource_get_string(local_a8.binarysource_);
    _Var5 = ptrlen_eq_string(pVar30,"auth-agent-req@openssh.com");
    if ((_Var5) &&
       (cVar6 = (**(code **)(*(long *)((plug[-0x80e].vt)->accepting + 8) + 0x70))(), cVar6 == '\0'))
    {
      local_60 = uVar11;
      puVar13 = (uint *)find234((tree234 *)plug[-6].vt,&local_68,(cmpfn234)0x0);
      if (puVar13 == (uint *)0x0) {
        pcVar27 = dupprintf("Agent forwarding request for unrecognised channel %u",
                            uVar12 & 0xffffffff);
        share_disconnect(cs,pcVar27);
LAB_00139dae:
        safefree(pcVar27);
      }
      else {
        psVar22 = strbuf_new();
        BinarySink_put_uint32(psVar22->binarysink_,(ulong)*puVar13);
        send_packet_to_downstream(cs,100,psVar22->s,(int)psVar22->len,(share_channel *)0x0);
        strbuf_free(psVar22);
      }
      goto LAB_00139534;
    }
    _Var5 = ptrlen_eq_string(pVar30,"x11-req");
    if (!_Var5) goto LAB_0013977d;
    local_60 = uVar11;
    puVar13 = (uint *)find234((tree234 *)plug[-6].vt,&local_68,(cmpfn234)0x0);
    if (puVar13 == (uint *)0x0) {
      pcVar27 = dupprintf("X11 forwarding request for unrecognised channel %u",uVar12 & 0xffffffff);
      share_disconnect(cs,pcVar27);
      safefree(pcVar27);
LAB_00139ee1:
      bVar3 = false;
      pcVar27 = (char *)0x0;
    }
    else {
      _Var5 = BinarySource_get_bool(local_a8.binarysource_);
      val = BinarySource_get_bool(local_a8.binarysource_);
      pVar30 = BinarySource_get_string(local_a8.binarysource_);
      uVar9 = x11_identify_auth_proto(pVar30);
      pVar30 = BinarySource_get_string(local_a8.binarysource_);
      uVar14 = BinarySource_get_uint32(local_a8.binarysource_);
      if ((local_a8.binarysource_)->err == BSE_NO_ERROR) {
        if ((int)uVar9 < 0) {
          psVar22 = strbuf_new();
          BinarySink_put_uint32(psVar22->binarysink_,(ulong)*puVar13);
          send_packet_to_downstream(cs,100,psVar22->s,(int)psVar22->len,(share_channel *)0x0);
        }
        else {
          puVar13[8] = uVar9;
          pvVar20 = x11_dehexify(pVar30,(int *)(puVar13 + 0xc));
          *(void **)(puVar13 + 10) = pvVar20;
          p_Var2 = (plug[-0x80e].vt)->accepting;
          uVar21 = (**(code **)(*(long *)(p_Var2 + 8) + 0x38))(p_Var2,uVar9,cs,puVar13);
          *(undefined8 *)(puVar13 + 6) = uVar21;
          *(_Bool *)(puVar13 + 0xd) = val;
          psVar22 = strbuf_new_nm();
          bs = psVar22->binarysink_;
          BinarySink_put_uint32(bs,uVar12 & 0xffffffff);
          BinarySink_put_stringz(bs,"x11-req");
          BinarySink_put_bool(bs,_Var5);
          BinarySink_put_bool(bs,val);
          BinarySink_put_stringz(bs,*(char **)(*(long *)(puVar13 + 6) + 0x18));
          BinarySink_put_stringz(bs,*(char **)(*(long *)(puVar13 + 6) + 0x20));
          local_c8 = (int)uVar14;
          BinarySink_put_uint32(bs,(long)local_c8);
          p_Var2 = (plug[-0x80e].vt)->accepting;
          (**(code **)(*(long *)(p_Var2 + 8) + 0x48))
                    (p_Var2,*(undefined4 *)&plug[-0x810].vt,0x62,psVar22->s);
        }
        strbuf_free(psVar22);
        goto LAB_00139ee1;
      }
      pcVar27 = dupprintf("Truncated CHANNEL_REQUEST(\"x11-req\") packet");
      bVar3 = true;
    }
    if (!bVar3) goto LAB_00139534;
  }
  else {
    switch(bVar1) {
    case 0x50:
      pVar30 = BinarySource_get_string(&local_a8);
      sVar4 = local_a8.pos;
      cVar7 = (code)BinarySource_get_bool(local_a8.binarysource_);
      _Var5 = ptrlen_eq_string(pVar30,"tcpip-forward");
      if (_Var5) {
        pVar30 = BinarySource_get_string(local_a8.binarysource_);
        uVar12 = BinarySource_get_uint32(local_a8.binarysource_);
        BVar25 = (local_a8.binarysource_)->err;
        if (BVar25 != BSE_NO_ERROR) goto LAB_00139bb2;
        pcVar27 = mkstr(pVar30);
        p_Var2 = (plug[-0x80e].vt)->accepting;
        uVar21 = 0;
        uVar31 = 0;
        psVar32 = cs;
        psVar16 = (ssh_rportfwd *)
                  (*(code *)**(undefined8 **)(p_Var2 + 8))(p_Var2,pcVar27,uVar12 & 0xffffffff);
        if (psVar16 == (ssh_rportfwd *)0x0) {
          if ((bool)cVar7) {
            send_packet_to_downstream(cs,0x52,anon_var_dwarf_34748 + 10,0,(share_channel *)0x0);
          }
        }
        else {
          *(undefined1 *)((long)plug + (sVar4 - 0x4057)) = 1;
          p_Var2 = (plug[-0x80e].vt)->accepting;
          pcVar28 = (char *)0x0;
          if (!(bool)cVar7) {
            pcVar28 = "upstream added want_reply flag";
          }
          (**(code **)(*(long *)(p_Var2 + 8) + 0x48))
                    (p_Var2,*(undefined4 *)&plug[-0x810].vt,0x50,pvVar20,iVar8,pcVar28,uVar21,uVar31
                     ,psVar32);
          psVar17 = share_add_forwarding(cs,pcVar27,(int)uVar12);
          p_Var2 = (plug[-0x80e].vt)->accepting;
          (**(code **)(*(long *)(p_Var2 + 8) + 0x60))(p_Var2,cs);
          if (psVar17 != (share_forwarding *)0x0) {
            p_Var18 = (_func_void_Plug_ptr_PlugLogType_SockAddr_ptr_int_char_ptr_int *)
                      safemalloc(1,0x18,0);
            *(undefined8 *)p_Var18 = 0;
            pPVar24 = (PlugVtable *)(plug + -2);
            if (plug[-1].vt != (PlugVtable *)0x0) {
              pPVar24 = plug[-1].vt;
            }
            pPVar24->log = p_Var18;
            *(share_forwarding **)(p_Var18 + 0x10) = psVar17;
            p_Var18[0xc] = cVar7;
            *(undefined4 *)(p_Var18 + 8) = 0;
            psVar17->rpf = psVar16;
          }
        }
LAB_0013a169:
        BVar25 = BSE_NO_ERROR;
        safefree(pcVar27);
        pcVar27 = (char *)0x0;
      }
      else {
        _Var5 = ptrlen_eq_string(pVar30,"cancel-tcpip-forward");
        if (!_Var5) {
          if ((bool)cVar7) {
            send_packet_to_downstream(cs,0x52,anon_var_dwarf_34748 + 10,0,(share_channel *)0x0);
          }
          goto LAB_00139534;
        }
        pVar30 = BinarySource_get_string(local_a8.binarysource_);
        uVar12 = BinarySource_get_uint32(local_a8.binarysource_);
        BVar25 = (local_a8.binarysource_)->err;
        if (BVar25 == BSE_NO_ERROR) {
          pcVar27 = mkstr(pVar30);
          psVar17 = share_find_forwarding(cs,pcVar27,(int)uVar12);
          if (psVar17 == (share_forwarding *)0x0) {
            if ((bool)cVar7) {
              send_packet_to_downstream(cs,0x52,anon_var_dwarf_34748 + 10,0,(share_channel *)0x0);
            }
          }
          else {
            p_Var2 = (plug[-0x80e].vt)->accepting;
            (**(code **)(*(long *)(p_Var2 + 8) + 8))(p_Var2,psVar17->rpf);
            *(undefined1 *)((long)plug + (sVar4 - 0x4057)) = 1;
            p_Var2 = (plug[-0x80e].vt)->accepting;
            (**(code **)(*(long *)(p_Var2 + 8) + 0x48))
                      (p_Var2,*(undefined4 *)&plug[-0x810].vt,0x50,pvVar20);
            p_Var2 = (plug[-0x80e].vt)->accepting;
            (**(code **)(*(long *)(p_Var2 + 8) + 0x60))(p_Var2,cs);
            p_Var18 = (_func_void_Plug_ptr_PlugLogType_SockAddr_ptr_int_char_ptr_int *)
                      safemalloc(1,0x18,0);
            *(undefined8 *)p_Var18 = 0;
            pPVar24 = (PlugVtable *)(plug + -2);
            if (plug[-1].vt != (PlugVtable *)0x0) {
              pPVar24 = plug[-1].vt;
            }
            pPVar24->log = p_Var18;
            *(share_forwarding **)(p_Var18 + 0x10) = psVar17;
            p_Var18[0xc] = cVar7;
            *(undefined4 *)(p_Var18 + 8) = 1;
          }
          goto LAB_0013a169;
        }
LAB_00139bb2:
        pcVar27 = dupprintf("Truncated GLOBAL_REQUEST packet");
      }
      if (BVar25 == BSE_NO_ERROR) goto LAB_00139534;
      break;
    default:
      goto switchD_00139658_caseD_51;
    case 0x5a:
      BinarySource_get_string(&local_a8);
      sVar4 = local_a8.pos;
      uVar12 = BinarySource_get_uint32(local_a8.binarysource_);
      p_Var2 = (plug[-0x80e].vt)->accepting;
      uVar9 = (**(code **)(*(long *)(p_Var2 + 8) + 0x50))(p_Var2,cs);
      BinarySource_get_uint32(local_a8.binarysource_);
      uVar14 = BinarySource_get_uint32(local_a8.binarysource_);
      if ((local_a8.binarysource_)->err == BSE_NO_ERROR) {
        share_add_channel(cs,(uint)uVar12,uVar9,0,3,(int)uVar14);
        *(uint *)((long)plug + (sVar4 - 0x4057)) =
             uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
        p_Var2 = (plug[-0x80e].vt)->accepting;
        (**(code **)(*(long *)(p_Var2 + 8) + 0x48))
                  (p_Var2,*(undefined4 *)&plug[-0x810].vt,0x5a,pvVar20);
        goto LAB_00139534;
      }
      pcVar27 = "Truncated CHANNEL_OPEN packet";
LAB_00139c29:
      pcVar27 = dupprintf(pcVar27);
      break;
    case 0x5b:
      if (0xf < iVar8) {
        uVar12 = BinarySource_get_uint32(&local_a8);
        sVar4 = local_a8.pos;
        uVar14 = BinarySource_get_uint32(local_a8.binarysource_);
        BinarySource_get_uint32(local_a8.binarysource_);
        uVar19 = BinarySource_get_uint32(local_a8.binarysource_);
        if ((local_a8.binarysource_)->err != BSE_NO_ERROR) {
          pcVar27 = "Truncated CHANNEL_OPEN_CONFIRMATION packet";
          goto LAB_00139c29;
        }
        uVar9 = (uint)uVar12;
        local_68 = uVar9;
        pcVar27 = (char *)find234((tree234 *)plug[-8].vt,&local_68,(cmpfn234)0x0);
        if (pcVar27 == (char *)0x0) {
          local_64 = uVar9;
          psVar23 = (share_xchannel *)find234((tree234 *)plug[-4].vt,&local_68,(cmpfn234)0x0);
          if (psVar23 == (share_xchannel *)0x0) {
            pcVar27 = "CHANNEL_OPEN_CONFIRMATION packet cited unknown channel %u";
            goto LAB_0013a19f;
          }
          uVar10 = psVar23->upstream_id;
          local_78 = psVar23;
          local_70 = pcVar27;
        }
        else {
          p_Var2 = (plug[-0x80e].vt)->accepting;
          local_70 = pcVar27;
          uVar10 = (**(code **)(*(long *)(p_Var2 + 8) + 0x50))(p_Var2,cs);
          local_78 = (share_xchannel *)0x0;
        }
        *(uint *)((long)pvVar20 + sVar4) =
             uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
        psVar15 = share_add_channel(cs,(uint)uVar14,uVar10,uVar9,0,(int)uVar19);
        pcVar27 = local_70;
        psVar23 = local_78;
        if (local_70 != (char *)0x0) {
          p_Var2 = (plug[-0x80e].vt)->accepting;
          (**(code **)(*(long *)(p_Var2 + 8) + 0x48))
                    (p_Var2,*(undefined4 *)&plug[-0x810].vt,0x5b,pvVar20);
          del234((tree234 *)plug[-8].vt,pcVar27);
          goto LAB_00139dae;
        }
        if (local_78 != (share_xchannel *)0x0) {
          uVar9 = *(uint *)((long)&plug[-0x80a].vt + 1);
          uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
          if (uVar9 < 0x100) {
            pcVar27 = dupprintf("Initial window size for x11 channel must be at least 256 (got %u)",
                                (ulong)uVar9);
            break;
          }
          share_xchannel_confirmation(cs,local_78,psVar15,uVar9);
          share_remove_xchannel(cs,psVar23);
        }
        goto LAB_00139534;
      }
      pcVar27 = dupprintf("Truncated CHANNEL_OPEN_CONFIRMATION packet");
      break;
    case 0x5c:
      uVar12 = BinarySource_get_uint32(&local_a8);
      if ((local_a8.binarysource_)->err != BSE_NO_ERROR) {
        pcVar27 = "Truncated CHANNEL_OPEN_FAILURE packet";
        goto LAB_00139c29;
      }
      local_68 = (uint)uVar12;
      pcVar27 = (char *)find234((tree234 *)plug[-8].vt,&local_68,(cmpfn234)0x0);
      if (pcVar27 != (char *)0x0) {
        p_Var2 = (plug[-0x80e].vt)->accepting;
        (**(code **)(*(long *)(p_Var2 + 8) + 0x48))
                  (p_Var2,*(undefined4 *)&plug[-0x810].vt,0x5c,pvVar20);
        del234((tree234 *)plug[-8].vt,pcVar27);
        goto LAB_00139dae;
      }
      local_64 = (uint)uVar12;
      psVar23 = (share_xchannel *)find234((tree234 *)plug[-4].vt,&local_68,(cmpfn234)0x0);
      if (psVar23 == (share_xchannel *)0x0) {
        pcVar27 = "CHANNEL_OPEN_FAILURE packet cited unknown channel %u";
LAB_0013a19f:
        pcVar27 = dupprintf(pcVar27,uVar12 & 0xffffffff);
        break;
      }
      share_xchannel_failure(cs,psVar23);
      goto LAB_00139534;
    case 0x5d:
    case 0x5e:
    case 0x5f:
    case 0x60:
    case 0x61:
    case 0x62:
    case 99:
    case 100:
      goto switchD_00139658_caseD_5d;
    }
  }
LAB_0013a179:
  if (pcVar27 == (char *)0x0) {
    __assert_fail("err != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/sharing.c",
                  0x6c6,
                  "void share_got_pkt_from_downstream(struct ssh_sharing_connstate *, int, unsigned char *, int)"
                 );
  }
  share_disconnect(cs,pcVar27);
  safefree(pcVar27);
  goto LAB_00139534;
}

Assistant:

static void share_receive(Plug *plug, int urgent, const char *data, size_t len)
{
    ssh_sharing_connstate *cs = container_of(
        plug, ssh_sharing_connstate, plug);
    static const char expected_verstring_prefix[] =
        "SSHCONNECTION@putty.projects.tartarus.org-2.0-";
    unsigned char c;

    crBegin(cs->crLine);

    /*
     * First read the version string from downstream.
     */
    cs->recvlen = 0;
    while (1) {
        crGetChar(c);
        if (c == '\012')
            break;
        if (cs->recvlen >= sizeof(cs->recvbuf)) {
            char *buf = dupprintf("Version string far too long\n");
            share_disconnect(cs, buf);
            sfree(buf);
            goto dead;
        }
        cs->recvbuf[cs->recvlen++] = c;
    }

    /*
     * Now parse the version string to make sure it's at least vaguely
     * sensible, and log it.
     */
    if (cs->recvlen < sizeof(expected_verstring_prefix)-1 ||
        memcmp(cs->recvbuf, expected_verstring_prefix,
               sizeof(expected_verstring_prefix) - 1)) {
        char *buf = dupprintf("Version string did not have expected prefix\n");
        share_disconnect(cs, buf);
        sfree(buf);
        goto dead;
    }
    if (cs->recvlen > 0 && cs->recvbuf[cs->recvlen-1] == '\015')
        cs->recvlen--;                 /* trim off \r before \n */
    ptrlen verstring = make_ptrlen(cs->recvbuf, cs->recvlen);
    log_downstream(cs, "Downstream version string: %.*s",
                   PTRLEN_PRINTF(verstring));
    cs->got_verstring = true;

    /*
     * Loop round reading packets.
     */
    while (1) {
        cs->recvlen = 0;
        while (cs->recvlen < 4) {
            crGetChar(c);
            cs->recvbuf[cs->recvlen++] = c;
        }
        cs->curr_packetlen = toint(GET_32BIT_MSB_FIRST(cs->recvbuf) + 4);
        if (cs->curr_packetlen < 5 ||
            cs->curr_packetlen > sizeof(cs->recvbuf)) {
            char *buf = dupprintf("Bad packet length %u\n",
                                  (unsigned)cs->curr_packetlen);
            share_disconnect(cs, buf);
            sfree(buf);
            goto dead;
        }
        while (cs->recvlen < cs->curr_packetlen) {
            crGetChar(c);
            cs->recvbuf[cs->recvlen++] = c;
        }

        share_got_pkt_from_downstream(cs, cs->recvbuf[4],
                                      cs->recvbuf + 5, cs->recvlen - 5);
    }

  dead:;
    crFinishV;
}